

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_writer_end(mz_zip_archive *pZip)

{
  void *__s;
  long in_RDI;
  mz_bool status;
  mz_zip_internal_state *pState;
  mz_bool local_34;
  
  if (((((in_RDI == 0) || (*(long *)(in_RDI + 0x58) == 0)) || (*(long *)(in_RDI + 0x20) == 0)) ||
      (*(long *)(in_RDI + 0x28) == 0)) ||
     ((*(int *)(in_RDI + 0x14) != 2 && (*(int *)(in_RDI + 0x14) != 3)))) {
    local_34 = 0;
  }
  else {
    __s = *(void **)(in_RDI + 0x58);
    *(undefined8 *)(in_RDI + 0x58) = 0;
    (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38));
    memset(__s,0,0x20);
    (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38));
    memset((void *)((long)__s + 0x20),0,0x20);
    (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38));
    memset((void *)((long)__s + 0x40),0,0x20);
    if (*(long *)((long)__s + 0x60) != 0) {
      fclose(*(FILE **)((long)__s + 0x60));
      *(undefined8 *)((long)__s + 0x60) = 0;
    }
    if ((*(code **)(in_RDI + 0x48) == tinyexr::miniz::mz_zip_heap_write_func) &&
       (*(long *)((long)__s + 0x68) != 0)) {
      (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38),*(undefined8 *)((long)__s + 0x68))
      ;
      *(undefined8 *)((long)__s + 0x68) = 0;
    }
    (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38),__s);
    *(undefined4 *)(in_RDI + 0x14) = 0;
    local_34 = 1;
  }
  return local_34;
}

Assistant:

mz_bool mz_zip_writer_end(mz_zip_archive *pZip) {
  mz_zip_internal_state *pState;
  mz_bool status = MZ_TRUE;
  if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) ||
      ((pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) &&
       (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED)))
    return MZ_FALSE;

  pState = pZip->m_pState;
  pZip->m_pState = NULL;
  mz_zip_array_clear(pZip, &pState->m_central_dir);
  mz_zip_array_clear(pZip, &pState->m_central_dir_offsets);
  mz_zip_array_clear(pZip, &pState->m_sorted_central_dir_offsets);

#ifndef MINIZ_NO_STDIO
  if (pState->m_pFile) {
    MZ_FCLOSE(pState->m_pFile);
    pState->m_pFile = NULL;
  }
#endif  // #ifndef MINIZ_NO_STDIO

  if ((pZip->m_pWrite == mz_zip_heap_write_func) && (pState->m_pMem)) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState->m_pMem);
    pState->m_pMem = NULL;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
  pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;
  return status;
}